

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

char * bc_shell_quote(char *command)

{
  char c;
  bc_string_t *str;
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  
  str = (bc_string_t *)bc_malloc(0x18);
  str->str = (char *)0x0;
  str->len = 0;
  str->allocated_len = 0;
  bc_string_append_len(str,"",0);
  bc_string_append_c(str,'\'');
  if ((command == (char *)0x0) || (*command == '\0')) {
    bc_string_append_c(str,'\'');
  }
  else {
    uVar3 = 0;
    do {
      c = command[uVar3];
      if (c == '\'') {
        pcVar2 = "\'\\\'\'";
LAB_00109de2:
        bc_string_append(str,pcVar2);
      }
      else {
        if (c == '!') {
          pcVar2 = "\'\\!\'";
          goto LAB_00109de2;
        }
        bc_string_append_c(str,c);
      }
      uVar3 = uVar3 + 1;
      sVar1 = strlen(command);
    } while (uVar3 < sVar1);
    bc_string_append_c(str,'\'');
    if (str == (bc_string_t *)0x0) {
      return (char *)0x0;
    }
  }
  pcVar2 = str->str;
  free(str);
  return pcVar2;
}

Assistant:

char*
bc_shell_quote(const char *command)
{
    bc_string_t *rv = bc_string_new();
    bc_string_append_c(rv, '\'');
    if (command != NULL) {
        for (size_t i = 0; i < strlen(command); i++) {
            switch (command[i]) {
                case '!':
                    bc_string_append(rv, "'\\!'");
                    break;
                case '\'':
                    bc_string_append(rv, "'\\''");
                    break;
                default:
                    bc_string_append_c(rv, command[i]);
            }
        }
    }
    bc_string_append_c(rv, '\'');
    return bc_string_free(rv, false);
}